

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitLoop
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,Loop *curr)

{
  bool bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined1 local_80 [8];
  Flow flow;
  
  flow.breakTo.super_IString.str._M_str._4_4_ = 0;
  do {
    visit((Flow *)local_80,this,curr->body);
    uVar3 = NONCONSTANT_FLOW._8_8_;
    uVar2 = NONCONSTANT_FLOW._0_8_;
    if ((flow.breakTo.super_IString.str._M_len == 0) ||
       ((char *)flow.breakTo.super_IString.str._M_len != (curr->name).super_IString.str._M_str)) {
      Flow::Flow(__return_storage_ptr__,(Flow *)local_80);
LAB_00787eea:
      bVar1 = false;
    }
    else {
      bVar1 = true;
      if ((this->maxLoopIterations != 0) &&
         (flow.breakTo.super_IString.str._M_str._4_4_ =
               flow.breakTo.super_IString.str._M_str._4_4_ + 1,
         this->maxLoopIterations <= flow.breakTo.super_IString.str._M_str._4_4_)) {
        *(char **)((long)&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.
                          fixed._M_elems[0].field_0.func.super_IString.str + 8) = (char *)0x0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
        type.id = 0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
        field_0.i64 = 0;
        (__return_storage_ptr__->breakTo).super_IString.str._M_len = uVar2;
        (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)uVar3;
        goto LAB_00787eea;
      }
    }
    SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_80);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

Flow visitLoop(Loop* curr) {
    NOTE_ENTER("Loop");
    Index loopCount = 0;
    while (1) {
      Flow flow = visit(curr->body);
      if (flow.breaking()) {
        if (flow.breakTo == curr->name) {
          if (maxLoopIterations != NO_LIMIT &&
              ++loopCount >= maxLoopIterations) {
            return Flow(NONCONSTANT_FLOW);
          }
          continue; // lol
        }
      }
      // loop does not loop automatically, only continue achieves that
      return flow;
    }
  }